

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zetMetricCreateFromProgrammableExp
          (zet_metric_programmable_exp_handle_t hMetricProgrammable,
          zet_metric_programmable_param_value_exp_t *pParameterValues,uint32_t parameterCount,
          char *pName,char *pDescription,uint32_t *pMetricHandleCount,
          zet_metric_handle_t *phMetricHandles)

{
  zet_metric_handle_t p_Var1;
  bool bVar2;
  ulong local_50;
  size_t i;
  zet_pfnMetricCreateFromProgrammableExp_t pfnCreateFromProgrammableExp;
  ze_result_t result;
  uint32_t *pMetricHandleCount_local;
  char *pDescription_local;
  char *pName_local;
  uint32_t parameterCount_local;
  zet_metric_programmable_param_value_exp_t *pParameterValues_local;
  zet_metric_programmable_exp_handle_t hMetricProgrammable_local;
  
  pfnCreateFromProgrammableExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c870 == (code *)0x0) {
    local_50 = 0;
    while( true ) {
      bVar2 = false;
      if (phMetricHandles != (zet_metric_handle_t *)0x0) {
        bVar2 = local_50 < *pMetricHandleCount;
      }
      if (!bVar2) break;
      p_Var1 = (zet_metric_handle_t)context_t::get((context_t *)&context);
      phMetricHandles[local_50] = p_Var1;
      local_50 = local_50 + 1;
    }
  }
  else {
    pfnCreateFromProgrammableExp._4_4_ =
         (*DAT_0011c870)(hMetricProgrammable,pParameterValues,parameterCount,pName,pDescription,
                         pMetricHandleCount,phMetricHandles);
  }
  return pfnCreateFromProgrammableExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricCreateFromProgrammableExp(
        zet_metric_programmable_exp_handle_t hMetricProgrammable,   ///< [in] handle of the metric programmable
        zet_metric_programmable_param_value_exp_t* pParameterValues,///< [in] list of parameter values to be set.
        uint32_t parameterCount,                        ///< [in] Count of parameters to set.
        const char* pName,                              ///< [in] pointer to metric name to be used. Must point to a
                                                        ///< null-terminated character array no longer than ::ZET_MAX_METRIC_NAME.
        const char* pDescription,                       ///< [in] pointer to metric description to be used. Must point to a
                                                        ///< null-terminated character array no longer than
                                                        ///< ::ZET_MAX_METRIC_DESCRIPTION.
        uint32_t* pMetricHandleCount,                   ///< [in,out] Pointer to the number of metric handles.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< number of metric handles available for this programmable.
                                                        ///< if count is greater than the number of metric handles available, then
                                                        ///< the driver shall update the value with the correct number of metric
                                                        ///< handles available.
        zet_metric_handle_t* phMetricHandles            ///< [in,out][optional][range(0,*pMetricHandleCount)] array of handle of metrics.
                                                        ///< if count is less than the number of metrics available, then driver
                                                        ///< shall only retrieve that number of metric handles.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnCreateFromProgrammableExp = context.zetDdiTable.MetricExp.pfnCreateFromProgrammableExp;
        if( nullptr != pfnCreateFromProgrammableExp )
        {
            result = pfnCreateFromProgrammableExp( hMetricProgrammable, pParameterValues, parameterCount, pName, pDescription, pMetricHandleCount, phMetricHandles );
        }
        else
        {
            // generic implementation
            for( size_t i = 0; ( nullptr != phMetricHandles ) && ( i < *pMetricHandleCount ); ++i )
                phMetricHandles[ i ] = reinterpret_cast<zet_metric_handle_t>( context.get() );

        }

        return result;
    }